

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O2

void __thiscall
duckdb_tdigest::TDigest::TDigest
          (TDigest *this,Value compression,Index unmergedSize,Index mergedSize)

{
  ulong uVar1;
  double dVar2;
  
  this->compression_ = compression;
  this->min_ = 1.79769313486232e+308;
  this->max_ = 2.2250738585072014e-308;
  if (mergedSize == 0) {
    dVar2 = ceil(compression);
    uVar1 = (ulong)(dVar2 + dVar2);
    mergedSize = (long)((dVar2 + dVar2) - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  }
  this->maxProcessed_ = mergedSize;
  if (unmergedSize == 0) {
    dVar2 = ceil(compression);
    uVar1 = (ulong)(dVar2 * 8.0);
    unmergedSize = (long)(dVar2 * 8.0 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  }
  this->maxUnprocessed_ = unmergedSize;
  this->processedWeight_ = 0.0;
  this->unprocessedWeight_ = 0.0;
  (this->processed_).
  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processed_).
  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processed_).
  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unprocessed_).
  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unprocessed_).
  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unprocessed_).
  super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cumulative_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>::reserve
            (&this->processed_,mergedSize);
  std::vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>::reserve
            (&this->unprocessed_,this->maxUnprocessed_ + 1);
  return;
}

Assistant:

TDigest(Value compression, Index unmergedSize, Index mergedSize)
	    : compression_(compression), maxProcessed_(processedSize(mergedSize, compression)),
	      maxUnprocessed_(unprocessedSize(unmergedSize, compression)) {
		processed_.reserve(maxProcessed_);
		unprocessed_.reserve(maxUnprocessed_ + 1);
	}